

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int secp256r1_key_exchange(ptls_iovec_t *pubkey,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  int iVar1;
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  ptls_iovec_t peerkey_local;
  
  iVar1 = secp_key_exchange(0x19f,pubkey,secret,peerkey);
  return iVar1;
}

Assistant:

static int secp256r1_key_exchange(ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    return secp_key_exchange(NID_X9_62_prime256v1, pubkey, secret, peerkey);
}